

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMarshall.c
# Opt level: O0

JL_STATUS JlMarshallFromStructToDataObject
                    (void *Structure,JlMarshallElement *StructDescription,
                    size_t StructDescriptionCount,JlDataObject *DictionaryObject)

{
  JL_DATA_TYPE JVar1;
  undefined4 local_2c;
  JL_STATUS jlStatus;
  JlDataObject *DictionaryObject_local;
  size_t StructDescriptionCount_local;
  JlMarshallElement *StructDescription_local;
  void *Structure_local;
  
  if ((((DictionaryObject == (JlDataObject *)0x0) || (StructDescription == (JlMarshallElement *)0x0)
       ) || (StructDescriptionCount == 0)) || (Structure == (void *)0x0)) {
    local_2c = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    JVar1 = JlGetObjectType(DictionaryObject);
    if (JVar1 == JL_DATA_TYPE_DICTIONARY) {
      local_2c = MarshallDictionary(Structure,StructDescription,StructDescriptionCount,
                                    DictionaryObject);
    }
    else {
      local_2c = JL_STATUS_WRONG_TYPE;
    }
  }
  return local_2c;
}

Assistant:

JL_STATUS
    JlMarshallFromStructToDataObject
    (
        void const*                 Structure,
        JlMarshallElement const*    StructDescription,
        size_t                      StructDescriptionCount,
        JlDataObject*               DictionaryObject
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DictionaryObject
        &&  NULL != StructDescription
        &&  0 != StructDescriptionCount
        &&  NULL != Structure )
    {
        if( JL_DATA_TYPE_DICTIONARY == JlGetObjectType( DictionaryObject ) )
        {
            jlStatus = MarshallDictionary( Structure, StructDescription, StructDescriptionCount, DictionaryObject );
        }
        else
        {
            // Root object must be a dictionary
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}